

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long>::on_chr
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *this)

{
  buffer<char> *pbVar1;
  unsigned_long uVar2;
  size_t sVar3;
  
  pbVar1 = (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  uVar2 = this->abs_value;
  if (pbVar1->capacity_ < pbVar1->size_ + 1) {
    (**pbVar1->_vptr_buffer)(pbVar1);
  }
  sVar3 = pbVar1->size_;
  pbVar1->size_ = sVar3 + 1;
  pbVar1->ptr_[sVar3] = (char)uVar2;
  return;
}

Assistant:

void on_chr() { *out++ = static_cast<Char>(abs_value); }